

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O0

cf_void_t cfx_cli_cmd_add_sub(cfx_cli_cmd_t *parent,cfx_cli_cmd_t *subcmd)

{
  cfx_cli_cmd_t *local_20;
  cfx_cli_cmd_t *p;
  cfx_cli_cmd_t *subcmd_local;
  cfx_cli_cmd_t *parent_local;
  
  if (parent->child == (cfx_cli_cmd_t *)0x0) {
    parent->child = subcmd;
    parent->child->prev = (cfx_cli_cmd_t *)0x0;
    parent->child->next = (cfx_cli_cmd_t *)0x0;
  }
  else {
    for (local_20 = parent->child; local_20->next != (cfx_cli_cmd_t *)0x0; local_20 = local_20->next
        ) {
    }
    subcmd->prev = local_20;
    subcmd->next = (cfx_cli_cmd_t *)0x0;
    local_20->next = subcmd;
  }
  return;
}

Assistant:

cf_void_t cfx_cli_cmd_add_sub(cfx_cli_cmd_t* parent, cfx_cli_cmd_t* subcmd) {
    cfx_cli_cmd_t* p;

    if (!parent->child) {
        parent->child = subcmd;
        parent->child->prev = CF_NULL_PTR;
        parent->child->next = CF_NULL_PTR;
    }
    else {
        p = parent->child;
        while (p->next) {
             p= p->next;
        }
        subcmd->prev = p;
        subcmd->next = CF_NULL_PTR;
        p->next = subcmd;
    }
}